

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O1

bool __thiscall
crnlib::texture_conversion::convert_stats::print
          (convert_stats *this,bool psnr_metrics,bool mip_stats,bool grayscale_sampling,
          char *pCSVStatsFile)

{
  uint uVar1;
  mipmapped_texture *pmVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar6;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar7;
  FILE *__s;
  ulong uVar8;
  uint uVar9;
  mipmapped_texture *pmVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  image_u8 grayscale_a;
  image_u8 grayscale_b;
  image_u8 b;
  dynamic_string filename;
  image_u8 a;
  error_metrics luma_error;
  error_metrics rgb_error;
  image<crnlib::color_quad<unsigned_char,_int>_> local_168;
  image<crnlib::color_quad<unsigned_char,_int>_> local_138;
  image_u8 local_108;
  mipmapped_texture *local_d8;
  char *local_d0;
  dynamic_string local_c8;
  image_u8 local_b8;
  error_metrics local_88;
  error_metrics local_58;
  
  pmVar10 = this->m_pInput_tex;
  if (pmVar10 != (mipmapped_texture *)0x0) {
    uVar9 = pmVar10->m_width;
    uVar4 = pmVar10->m_height;
    uVar1 = (pmVar10->m_faces).m_size;
    uVar14 = 0;
    uVar11 = 0;
    if (uVar1 != 0) {
      uVar11 = ((pmVar10->m_faces).m_p)->m_size;
    }
    local_d0 = pCSVStatsFile;
    pcVar5 = pixel_format_helpers::get_pixel_format_string(pmVar10->m_format);
    console::info("Input texture: %ux%u, Levels: %u, Faces: %u, Format: %s",(ulong)uVar9,
                  (ulong)uVar4,(ulong)uVar11,(ulong)uVar1,pcVar5);
    console::info("Input pixels: %u, Input file size: %u, Input bits/pixel: %1.3f",
                  SUB84((double)(((float)this->m_input_file_size * 8.0) /
                                (float)this->m_total_input_pixels),0));
    uVar9 = (this->m_output_tex).m_width;
    uVar4 = (this->m_output_tex).m_height;
    uVar1 = (this->m_output_tex).m_faces.m_size;
    if (uVar1 != 0) {
      uVar14 = ((this->m_output_tex).m_faces.m_p)->m_size;
    }
    pixel_format_helpers::get_pixel_format_string((this->m_output_tex).m_format);
    console::info("Output texture: %ux%u, Levels: %u, Faces: %u, Format: %s",(ulong)uVar9,
                  (ulong)uVar4,(ulong)uVar14,(ulong)uVar1);
    console::info("Output pixels: %u, Output file size: %u, Output bits/pixel: %1.3f",
                  SUB84((double)(((float)this->m_output_file_size * 8.0) /
                                (float)this->m_total_output_pixels),0));
    if (this->m_output_comp_file_size != 0) {
      console::info("LZMA compressed output file size: %u bytes, %1.3f bits/pixel",
                    SUB84((double)(((float)this->m_output_comp_file_size * 8.0) /
                                  (float)this->m_total_output_pixels),0));
    }
    if (psnr_metrics) {
      pmVar2 = this->m_pInput_tex;
      if ((pmVar2->m_width == (this->m_output_tex).m_width) &&
         (pmVar2->m_height == (this->m_output_tex).m_height)) {
        uVar14 = (pmVar2->m_faces).m_size;
        uVar12 = (this->m_output_tex).m_faces.m_size;
        if (uVar14 == uVar12) {
          uVar4 = 0;
          uVar9 = 0;
          if (uVar14 != 0) {
            uVar9 = ((pmVar2->m_faces).m_p)->m_size;
          }
          if (uVar12 != 0) {
            uVar4 = ((this->m_output_tex).m_faces.m_p)->m_size;
          }
          if (uVar9 < uVar4) {
            uVar4 = uVar9;
          }
          uVar9 = 1;
          if (mip_stats) {
            uVar9 = uVar4;
          }
          local_d8 = pmVar10;
          if (uVar14 != 0) {
            uVar4 = 0;
            do {
              if (uVar9 != 0) {
                uVar8 = 0;
                do {
                  local_b8.m_width = 0;
                  local_b8.m_height = 0;
                  local_b8.m_pitch = 0;
                  local_b8.m_total = 0;
                  local_b8.m_comp_flags = 0xf;
                  local_b8.m_pixel_buf.m_size = 0;
                  local_b8.m_pixel_buf.m_capacity = 0;
                  local_b8.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                  local_b8.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                  local_108.m_width = 0;
                  local_108.m_height = 0;
                  local_108.m_pitch = 0;
                  local_108.m_total = 0;
                  local_108.m_comp_flags = 0xf;
                  local_108.m_pixel_buf.m_size = 0;
                  local_108.m_pixel_buf.m_capacity = 0;
                  local_108.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                  local_108.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                  uVar12 = (uint)uVar8;
                  piVar6 = mipmapped_texture::get_level_image
                                     (this->m_pInput_tex,uVar4,uVar12,&local_b8,3);
                  piVar7 = mipmapped_texture::get_level_image
                                     (&this->m_output_tex,uVar4,uVar12,&local_108,3);
                  if (piVar7 != (image_u8 *)0x0 && piVar6 != (image_u8 *)0x0) {
                    local_168.m_width = 0;
                    local_168.m_height = 0;
                    local_168.m_pitch = 0;
                    local_168.m_total = 0;
                    local_168.m_comp_flags = 0xf;
                    local_168.m_pixel_buf.m_size = 0;
                    local_168.m_pixel_buf.m_capacity = 0;
                    local_168.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                    local_168.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                    local_138.m_width = 0;
                    local_138.m_height = 0;
                    local_138.m_pitch = 0;
                    local_138.m_total = 0;
                    local_138.m_comp_flags = 0xf;
                    local_138.m_pixel_buf.m_size = 0;
                    local_138.m_pixel_buf.m_capacity = 0;
                    local_138.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                    local_138.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                    if (grayscale_sampling) {
                      image<crnlib::color_quad<unsigned_char,_int>_>::operator=(&local_168,piVar6);
                      image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
                                (&local_168);
                      image<crnlib::color_quad<unsigned_char,_int>_>::operator=(&local_138,piVar7);
                      piVar7 = &local_138;
                      image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale(piVar7);
                      piVar6 = &local_168;
                    }
                    console::info("Face %u Mipmap level %u statistics:",(ulong)uVar4,uVar8);
                    image_utils::print_image_metrics(piVar6,piVar7);
                    if (((piVar6->m_comp_flags & 7) != 0) || ((piVar7->m_comp_flags & 7) != 0)) {
                      image_utils::print_ssim(piVar6,piVar7);
                    }
                    if (local_138.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                      crnlib_free(local_138.m_pixel_buf.m_p);
                    }
                    if (local_168.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                      crnlib_free(local_168.m_pixel_buf.m_p);
                    }
                  }
                  if (local_108.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                    crnlib_free(local_108.m_pixel_buf.m_p);
                  }
                  if (local_b8.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                    crnlib_free(local_b8.m_pixel_buf.m_p);
                  }
                  uVar8 = (ulong)(uVar12 + 1);
                } while (uVar9 != uVar12 + 1);
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 != uVar14);
          }
          pcVar5 = local_d0;
          pmVar10 = local_d8;
          if (local_d0 != (char *)0x0) {
            local_b8.m_width = 0;
            local_b8.m_height = 0;
            local_b8.m_pitch = 0;
            local_b8.m_total = 0;
            local_b8.m_comp_flags = 0xf;
            local_b8.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
            local_b8.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
            local_b8.m_pixel_buf.m_size = 0;
            local_b8.m_pixel_buf.m_capacity = 0;
            local_108.m_width = 0;
            local_108.m_height = 0;
            local_108.m_pitch = 0;
            local_108.m_total = 0;
            local_108.m_comp_flags = 0xf;
            local_108.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
            local_108.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
            local_108.m_pixel_buf.m_size = 0;
            local_108.m_pixel_buf.m_capacity = 0;
            piVar7 = mipmapped_texture::get_level_image(this->m_pInput_tex,0,0,&local_b8,3);
            piVar6 = mipmapped_texture::get_level_image(&this->m_output_tex,0,0,&local_108,3);
            if (piVar6 != (image_u8 *)0x0 && piVar7 != (image_u8 *)0x0) {
              local_168.m_width = 0;
              local_168.m_height = 0;
              local_168.m_pitch = 0;
              local_168.m_total = 0;
              local_168.m_comp_flags = 0xf;
              local_168.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
              local_168.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
              local_168.m_pixel_buf.m_size = 0;
              local_168.m_pixel_buf.m_capacity = 0;
              local_138.m_width = 0;
              local_138.m_height = 0;
              local_138.m_pitch = 0;
              local_138.m_total = 0;
              local_138.m_comp_flags = 0xf;
              local_138.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
              local_138.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
              local_138.m_pixel_buf.m_size = 0;
              local_138.m_pixel_buf.m_capacity = 0;
              if (grayscale_sampling) {
                image<crnlib::color_quad<unsigned_char,_int>_>::operator=(&local_168,piVar7);
                piVar7 = &local_168;
                image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale(piVar7);
                image<crnlib::color_quad<unsigned_char,_int>_>::operator=(&local_138,piVar6);
                image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale(&local_138);
                piVar6 = &local_138;
              }
              local_58.mMeanSquared = 0.0;
              local_58.mRootMeanSquared = 0.0;
              local_58.mMax = 0;
              local_58._4_4_ = 0;
              local_58.mMean = 0.0;
              local_58.mPeakSNR = 0.0;
              local_88.mPeakSNR = 0.0;
              local_88.mMeanSquared = 0.0;
              local_88.mRootMeanSquared = 0.0;
              local_88.mMax = 0;
              local_88._4_4_ = 0;
              local_88.mMean = 0.0;
              bVar3 = image_utils::error_metrics::compute(&local_58,piVar7,piVar6,0,3,false);
              if ((bVar3) &&
                 (bVar3 = image_utils::error_metrics::compute(&local_88,piVar7,piVar6,0,0,true),
                 bVar3)) {
                bVar3 = file_utils::does_file_exist(pcVar5);
                __s = fopen64(pcVar5,"a");
                if (__s == (FILE *)0x0) {
                  console::warning("Unable to append to CSV stats file: %s\n",pcVar5);
                }
                else {
                  if (!bVar3) {
                    fwrite("name,width,height,miplevels,rgb_rms,luma_rms,effective_output_size,effective_bitrate\n"
                           ,0x55,1,__s);
                  }
                  local_c8.m_buf_size = 0;
                  local_c8.m_len = 0;
                  local_c8.m_pStr = (char *)0x0;
                  pcVar5 = (this->m_src_filename).m_pStr;
                  if (pcVar5 == (char *)0x0) {
                    pcVar5 = "";
                  }
                  file_utils::split_path
                            (pcVar5,(dynamic_string *)0x0,(dynamic_string *)0x0,&local_c8,
                             (dynamic_string *)0x0);
                  uVar8 = this->m_output_comp_file_size;
                  if (uVar8 == 0) {
                    uVar8 = this->m_output_file_size;
                  }
                  pcVar5 = "";
                  if (local_c8.m_pStr != (char *)0x0) {
                    pcVar5 = local_c8.m_pStr;
                  }
                  if ((this->m_output_tex).m_faces.m_size == 0) {
                    uVar13 = 0;
                  }
                  else {
                    uVar13 = (ulong)((this->m_output_tex).m_faces.m_p)->m_size;
                  }
                  fprintf(__s,"%s,%u,%u,%u,%f,%f,%u,%f\n",SUB84(local_58.mRootMeanSquared,0),
                          local_88.mRootMeanSquared,
                          (double)(((float)uVar8 * 8.0) / (float)this->m_total_output_pixels),pcVar5
                          ,(ulong)piVar6->m_width,(ulong)piVar6->m_height,uVar13,(int)uVar8);
                  fclose(__s);
                  dynamic_string::~dynamic_string(&local_c8);
                }
              }
              image<crnlib::color_quad<unsigned_char,_int>_>::~image(&local_138);
              image<crnlib::color_quad<unsigned_char,_int>_>::~image(&local_168);
            }
            if (local_108.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
              crnlib_free(local_108.m_pixel_buf.m_p);
            }
            if (local_b8.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
              crnlib_free(local_b8.m_pixel_buf.m_p);
            }
          }
          goto LAB_001488bb;
        }
      }
      console::warning(
                      "Unable to compute image statistics - input/output texture dimensions are different."
                      );
    }
  }
LAB_001488bb:
  return pmVar10 != (mipmapped_texture *)0x0;
}

Assistant:

bool convert_stats::print(bool psnr_metrics, bool mip_stats, bool grayscale_sampling, const char* pCSVStatsFile) const
        {
            if (!m_pInput_tex)
            {
                return false;
            }

            console::info("Input texture: %ux%u, Levels: %u, Faces: %u, Format: %s",
                m_pInput_tex->get_width(),
                m_pInput_tex->get_height(),
                m_pInput_tex->get_num_levels(),
                m_pInput_tex->get_num_faces(),
                pixel_format_helpers::get_pixel_format_string(m_pInput_tex->get_format()));

            // Just casting the uint64's filesizes to uint32 here to work around gcc issues - it's not even possible to have files that large anyway.
            console::info("Input pixels: %u, Input file size: %u, Input bits/pixel: %1.3f",
                m_total_input_pixels, (uint32)m_input_file_size, (m_input_file_size * 8.0f) / m_total_input_pixels);

            console::info("Output texture: %ux%u, Levels: %u, Faces: %u, Format: %s",
                m_output_tex.get_width(),
                m_output_tex.get_height(),
                m_output_tex.get_num_levels(),
                m_output_tex.get_num_faces(),
                pixel_format_helpers::get_pixel_format_string(m_output_tex.get_format()));

            console::info("Output pixels: %u, Output file size: %u, Output bits/pixel: %1.3f",
                m_total_output_pixels, (uint32)m_output_file_size, (m_output_file_size * 8.0f) / m_total_output_pixels);

            if (m_output_comp_file_size)
            {
                console::info("LZMA compressed output file size: %u bytes, %1.3f bits/pixel",
                    (uint32)m_output_comp_file_size, (m_output_comp_file_size * 8.0f) / m_total_output_pixels);
            }
            if (psnr_metrics)
            {
                if ((m_pInput_tex->get_width() != m_output_tex.get_width()) || (m_pInput_tex->get_height() != m_output_tex.get_height()) || (m_pInput_tex->get_num_faces() != m_output_tex.get_num_faces()))
                {
                    console::warning("Unable to compute image statistics - input/output texture dimensions are different.");
                }
                else
                {
                    uint num_faces = math::minimum(m_pInput_tex->get_num_faces(), m_output_tex.get_num_faces());
                    uint num_levels = math::minimum(m_pInput_tex->get_num_levels(), m_output_tex.get_num_levels());

                    if (!mip_stats)
                    {
                        num_levels = 1;
                    }

                    for (uint face = 0; face < num_faces; face++)
                    {
                        for (uint level = 0; level < num_levels; level++)
                        {
                            image_u8 a, b;
                            image_u8* pA = m_pInput_tex->get_level_image(face, level, a);
                            image_u8* pB = m_output_tex.get_level_image(face, level, b);

                            if (pA && pB)
                            {
                                image_u8 grayscale_a, grayscale_b;
                                if (grayscale_sampling)
                                {
                                    grayscale_a = *pA;
                                    grayscale_a.convert_to_grayscale();
                                    pA = &grayscale_a;

                                    grayscale_b = *pB;
                                    grayscale_b.convert_to_grayscale();
                                    pB = &grayscale_b;
                                }

                                console::info("Face %u Mipmap level %u statistics:", face, level);
                                image_utils::print_image_metrics(*pA, *pB);

                                if ((pA->has_rgb()) || (pB->has_rgb()))
                                {
                                    image_utils::print_ssim(*pA, *pB);
                                }
                            }
                        }
                    }

                    if (pCSVStatsFile)
                    {
                        // FIXME: This is kind of a hack, and should be combined with the code above.
                        image_u8 a, b;
                        image_u8* pA = m_pInput_tex->get_level_image(0, 0, a);
                        image_u8* pB = m_output_tex.get_level_image(0, 0, b);
                        if (pA && pB)
                        {
                            image_u8 grayscale_a, grayscale_b;
                            if (grayscale_sampling)
                            {
                                grayscale_a = *pA;
                                grayscale_a.convert_to_grayscale();
                                pA = &grayscale_a;

                                grayscale_b = *pB;
                                grayscale_b.convert_to_grayscale();
                                pB = &grayscale_b;
                            }

                            image_utils::error_metrics rgb_error;
                            image_utils::error_metrics luma_error;
                            if (rgb_error.compute(*pA, *pB, 0, 3, false) && luma_error.compute(*pA, *pB, 0, 0, true))
                            {
                                bool bCSVStatsFileExists = file_utils::does_file_exist(pCSVStatsFile);
                                FILE* pFile;
                                crn_fopen(&pFile, pCSVStatsFile, "a");
                                if (!pFile)
                                {
                                    console::warning("Unable to append to CSV stats file: %s\n", pCSVStatsFile);
                                }
                                else
                                {
                                    if (!bCSVStatsFileExists)
                                    {
                                        fprintf(pFile, "name,width,height,miplevels,rgb_rms,luma_rms,effective_output_size,effective_bitrate\n");
                                    }
                                    dynamic_string filename;
                                    file_utils::split_path(m_src_filename.get_ptr(), nullptr, nullptr, &filename, nullptr);

                                    uint64 effective_output_size = m_output_comp_file_size ? m_output_comp_file_size : m_output_file_size;
                                    float bitrate = (effective_output_size * 8.0f) / m_total_output_pixels;
                                    fprintf(pFile, "%s,%u,%u,%u,%f,%f,%u,%f\n",
                                        filename.get_ptr(),
                                        pB->get_width(), pB->get_height(), m_output_tex.get_num_levels(),
                                        rgb_error.mRootMeanSquared, luma_error.mRootMeanSquared,
                                        (uint32)effective_output_size, bitrate);
                                    fclose(pFile);
                                }
                            }
                        }
                    }
                }
            }

            return true;
        }